

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

int __thiscall Cleaner::CleanAll(Cleaner *this,bool generator)

{
  Edge *this_00;
  bool bVar1;
  reference ppEVar2;
  reference ppNVar3;
  string *path;
  bool local_79;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_70;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_68;
  iterator out_node;
  allocator<char> local_49;
  string local_48;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_28;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_20;
  iterator e;
  bool generator_local;
  Cleaner *this_local;
  
  e._M_current._7_1_ = generator;
  Reset(this);
  PrintHeader(this);
  LoadDyndeps(this);
  local_20._M_current =
       (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(&this->state_->edges_);
  while( true ) {
    local_28._M_current =
         (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(&this->state_->edges_);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_20);
    bVar1 = Edge::is_phony(*ppEVar2);
    if (!bVar1) {
      out_node._M_current._3_1_ = 0;
      bVar1 = (e._M_current._7_1_ & 1) == 0;
      local_79 = false;
      if (bVar1) {
        ppEVar2 = __gnu_cxx::
                  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_20);
        this_00 = *ppEVar2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"generator",&local_49);
        out_node._M_current._3_1_ = 1;
        local_79 = Edge::GetBindingBool(this_00,&local_48);
      }
      if ((out_node._M_current._3_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_48);
      }
      if (bVar1) {
        std::allocator<char>::~allocator(&local_49);
      }
      if (local_79 == false) {
        ppEVar2 = __gnu_cxx::
                  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_20);
        local_68._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar2)->outputs_);
        while( true ) {
          ppEVar2 = __gnu_cxx::
                    __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                    operator*(&local_20);
          local_70._M_current =
               (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar2)->outputs_);
          bVar1 = __gnu_cxx::operator!=(&local_68,&local_70);
          if (!bVar1) break;
          ppNVar3 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_68);
          path = Node::path_abi_cxx11_(*ppNVar3);
          Remove(this,path);
          __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
          operator++(&local_68);
        }
        ppEVar2 = __gnu_cxx::
                  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_20);
        RemoveEdgeFiles(this,*ppEVar2);
      }
    }
    __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::operator++
              (&local_20);
  }
  PrintFooter(this);
  return this->status_;
}

Assistant:

int Cleaner::CleanAll(bool generator) {
  Reset();
  PrintHeader();
  LoadDyndeps();
  for (vector<Edge*>::iterator e = state_->edges_.begin();
       e != state_->edges_.end(); ++e) {
    // Do not try to remove phony targets
    if ((*e)->is_phony())
      continue;
    // Do not remove generator's files unless generator specified.
    if (!generator && (*e)->GetBindingBool("generator"))
      continue;
    for (vector<Node*>::iterator out_node = (*e)->outputs_.begin();
         out_node != (*e)->outputs_.end(); ++out_node) {
      Remove((*out_node)->path());
    }

    RemoveEdgeFiles(*e);
  }
  PrintFooter();
  return status_;
}